

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O3

xmlNodePtr xmlNewDocNodeEatName(xmlDocPtr doc,xmlNsPtr ns,xmlChar *name,xmlChar *content)

{
  _xmlNode *p_Var1;
  _xmlNode *p_Var2;
  int iVar3;
  xmlNodePtr pxVar4;
  _xmlNode *p_Var5;
  
  pxVar4 = xmlNewNodeEatName(ns,name);
  if (pxVar4 == (xmlNodePtr)0x0) {
    if ((name != (xmlChar *)0x0) &&
       (((doc == (xmlDocPtr)0x0 || (doc->dict == (xmlDictPtr)0x0)) ||
        (iVar3 = xmlDictOwns(doc->dict,name), iVar3 == 0)))) {
      (*xmlFree)(name);
    }
  }
  else {
    pxVar4->doc = doc;
    if (content != (xmlChar *)0x0) {
      p_Var5 = xmlStringGetNodeList(doc,content);
      pxVar4->children = p_Var5;
      if (p_Var5 == (xmlNodePtr)0x0) {
        pxVar4->last = (_xmlNode *)0x0;
      }
      else {
        p_Var2 = p_Var5->next;
        while (p_Var1 = p_Var2, p_Var1 != (_xmlNode *)0x0) {
          p_Var5->parent = pxVar4;
          p_Var5 = p_Var1;
          p_Var2 = p_Var1->next;
        }
        p_Var5->parent = pxVar4;
        pxVar4->last = p_Var5;
      }
    }
  }
  return pxVar4;
}

Assistant:

xmlNodePtr
xmlNewDocNodeEatName(xmlDocPtr doc, xmlNsPtr ns,
              xmlChar *name, const xmlChar *content) {
    xmlNodePtr cur;

    cur = xmlNewNodeEatName(ns, name);
    if (cur != NULL) {
        cur->doc = doc;
	if (content != NULL) {
	    cur->children = xmlStringGetNodeList(doc, content);
	    UPDATE_LAST_CHILD_AND_PARENT(cur)
	}
    } else {
        /* if name don't come from the doc dictionary free it here */
        if ((name != NULL) &&
            ((doc == NULL) || (doc->dict == NULL) ||
	     (!(xmlDictOwns(doc->dict, name)))))
	    xmlFree(name);
    }
    return(cur);
}